

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

Constant *
spvtools::opt::anon_unknown_0::ConvertWordsToNumericScalarOrVectorConstant
          (ConstantManager *const_mgr,vector<unsigned_int,_std::allocator<unsigned_int>_> *words,
          Type *type)

{
  int iVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  size_type sVar3;
  const_reference pvVar4;
  Constant *pCVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Vector *vec_type;
  Integer *int_type;
  Type *type_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *words_local;
  ConstantManager *const_mgr_local;
  Integer *this;
  
  iVar1 = (*type->_vptr_Type[10])();
  this = (Integer *)CONCAT44(extraout_var,iVar1);
  if ((this != (Integer *)0x0) && (uVar2 = analysis::Integer::width(this), uVar2 < 0x21)) {
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(words);
    if (sVar3 == 1) {
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](words,0);
      pCVar5 = analysis::ConstantManager::GenerateIntegerConstant(const_mgr,this,(ulong)*pvVar4);
      return pCVar5;
    }
    __assert_fail("words.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0xc3,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::ConvertWordsToNumericScalarOrVectorConstant(analysis::ConstantManager *, const std::vector<uint32_t> &, const analysis::Type *)"
                 );
  }
  if ((this == (Integer *)0x0) &&
     (iVar1 = (*type->_vptr_Type[0xc])(), CONCAT44(extraout_var_00,iVar1) == 0)) {
    iVar1 = (*type->_vptr_Type[0xe])();
    if ((Vector *)CONCAT44(extraout_var_01,iVar1) != (Vector *)0x0) {
      pCVar5 = analysis::ConstantManager::GetNumericVectorConstantWithWords
                         (const_mgr,(Vector *)CONCAT44(extraout_var_01,iVar1),words);
      return pCVar5;
    }
    return (Constant *)0x0;
  }
  pCVar5 = analysis::ConstantManager::GetConstant(const_mgr,type,words);
  return pCVar5;
}

Assistant:

const analysis::Constant* ConvertWordsToNumericScalarOrVectorConstant(
    analysis::ConstantManager* const_mgr, const std::vector<uint32_t>& words,
    const analysis::Type* type) {
  const spvtools::opt::analysis::Integer* int_type = type->AsInteger();

  if (int_type && int_type->width() <= 32) {
    assert(words.size() == 1);
    return const_mgr->GenerateIntegerConstant(int_type, words[0]);
  }

  if (int_type || type->AsFloat()) return const_mgr->GetConstant(type, words);
  if (const auto* vec_type = type->AsVector())
    return const_mgr->GetNumericVectorConstantWithWords(vec_type, words);
  return nullptr;
}